

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::LiteralStringWithPropertyStringPtr::SetPropertyString
          (LiteralStringWithPropertyStringPtr *this,PropertyString *propStr)

{
  PropertyRecord *local_20;
  PropertyRecord *localPropertyRecord;
  PropertyString *propStr_local;
  LiteralStringWithPropertyStringPtr *this_local;
  
  localPropertyRecord = (PropertyRecord *)propStr;
  propStr_local = (PropertyString *)this;
  Memory::WriteBarrierPtr<Js::PropertyString>::operator=(&this->propertyString,propStr);
  if (localPropertyRecord != (PropertyRecord *)0x0) {
    (*(localPropertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x61])(localPropertyRecord,&local_20,0);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=(&this->propertyRecord,local_20);
  }
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::SetPropertyString(PropertyString * propStr)
    {
        this->propertyString = propStr;
        if (propStr != nullptr)
        {
            Js::PropertyRecord const * localPropertyRecord;
            propStr->GetPropertyRecord(&localPropertyRecord);
            this->propertyRecord = localPropertyRecord;
        }
    }